

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerIntegerParameter
          (DefaultsTest *this,GLenum pname,GLint expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  char *local_350;
  MessageBuilder local_348;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLint value;
  Functions *gl;
  GLint expected_value_local;
  GLenum pname_local;
  DefaultsTest *this_local;
  
  gl._0_4_ = expected_value;
  gl._4_4_ = pname;
  _expected_value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = -1;
  (**(code **)(lStack_28 + 0xa50))(this->m_sampler_dsa,gl._4_4_,&local_2c);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"glGetSamplerParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x107);
  if (local_2c == -1) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [40])"glGetSamplerParameteriv with parameter ");
    local_1c8[0] = glu::getTextureParameterName(gl._4_4_);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [61])0x2a829c0);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_local._7_1_ = false;
  }
  else if ((GLint)gl == local_2c) {
    this_local._7_1_ = true;
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_348,(char (*) [40])"glGetSamplerParameteriv with parameter ");
    local_350 = glu::getTextureParameterName(gl._4_4_);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_350);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])0x2a82a41);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2c);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2a7e7ab);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&gl);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])0x2a7d12b);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultsTest::testSamplerIntegerParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLint value = -1;

	gl.getSamplerParameteriv(m_sampler_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameteriv have failed");

	if (-1 == value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetSamplerParameteriv with parameter " << glu::getTextureParameterName(pname)
			<< " has not returned anything and error has not been generated." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (expected_value != value)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameteriv with parameter "
												<< glu::getTextureParameterName(pname) << " has returned " << value
												<< ", however " << expected_value << " was expected."
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}